

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyReadString(Scl_Tree_t *p,Scl_Pair_t Pair)

{
  int iVar1;
  char *Buffer;
  Scl_Tree_t *p_local;
  Scl_Pair_t Pair_local;
  
  p_local._4_4_ = Pair.End;
  p_local._0_4_ = Pair.Beg;
  iVar1 = Vec_StrSize(p->vBuffer);
  if (iVar1 < (p_local._4_4_ - (int)p_local) + 2) {
    Vec_StrFill(p->vBuffer,(p_local._4_4_ - (int)p_local) + 100,'\0');
  }
  Pair_local = (Scl_Pair_t)Vec_StrArray(p->vBuffer);
  strncpy((char *)Pair_local,p->pContents + (int)p_local,(long)(p_local._4_4_ - (int)p_local));
  if (((int)p_local < p_local._4_4_) && (*(char *)Pair_local == '\"')) {
    if (*(char *)((long)Pair_local + (long)((p_local._4_4_ - (int)p_local) + -1)) != '\"') {
      __assert_fail("Buffer[Pair.End-Pair.Beg-1] == \'\\\"\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                    ,0x160,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
    }
    *(char *)((long)Pair_local + (long)((p_local._4_4_ - (int)p_local) + -1)) = '\0';
    Pair_local = (Scl_Pair_t)((long)Pair_local + 1);
  }
  else {
    *(char *)((long)Pair_local + (long)(p_local._4_4_ - (int)p_local)) = '\0';
  }
  return (char *)Pair_local;
}

Assistant:

char * Scl_LibertyReadString( Scl_Tree_t * p, Scl_Pair_t Pair )   
{ 
    // static char Buffer[ABC_MAX_LIB_STR_LEN]; 
    char * Buffer;
    if ( Pair.End - Pair.Beg + 2 > Vec_StrSize(p->vBuffer) )
        Vec_StrFill( p->vBuffer, Pair.End - Pair.Beg + 100, '\0' );
    Buffer = Vec_StrArray( p->vBuffer );
    strncpy( Buffer, p->pContents+Pair.Beg, Pair.End-Pair.Beg ); 
    if ( Pair.Beg < Pair.End && Buffer[0] == '\"' )
    {
        assert( Buffer[Pair.End-Pair.Beg-1] == '\"' );
        Buffer[Pair.End-Pair.Beg-1] = 0;
        return Buffer + 1;
    }
    Buffer[Pair.End-Pair.Beg] = 0;
    return Buffer;
}